

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

string * __thiscall
jsoncons::jsonpath::detail::
base_selector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
::to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,int level)

{
  long *plVar1;
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < level) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
               (char)level * '\x02');
  }
  plVar1 = *(long **)((long)this + 0x18);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x28))(local_40,plVar1,level);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(int level) const override
        {
            std::string s;
            if (level > 0)
            {
                s.append("\n");
                s.append(std::size_t(level)*2, ' ');
            }
            if (tail_)
            {
                s.append(tail_->to_string(level));
            }
            return s;
        }